

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.h
# Opt level: O3

ostream * wasm::operator<<(ostream *os,RepeatedSubstring *substring)

{
  ostream *poVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"SuffixTree::RepeatedSubstring{",0x1e);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"u, (std::vector<unsigned>{",0x1a);
  if ((substring->StartIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (substring->StartIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      uVar2 = (long)(substring->StartIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(substring->StartIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      if (uVar2 - 1 != uVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        uVar2 = (long)(substring->StartIndices).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(substring->StartIndices).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"})}",3);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os,
                                  RepeatedSubstring substring) {
    os << "SuffixTree::RepeatedSubstring{" << substring.Length
       << "u, (std::vector<unsigned>{";
    for (unsigned idx = 0; idx < substring.StartIndices.size(); idx++) {
      os << substring.StartIndices[idx];
      if (idx != substring.StartIndices.size() - 1) {
        os << ", ";
      }
    }
    return os << "})}";
  }